

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapGrowBucket(jx9_hashmap *pMap)

{
  uint uVar1;
  jx9_hashmap_node **pChunk;
  jx9_hashmap_node *pjVar2;
  sxu32 sVar3;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  sxu32 sVar8;
  
  iVar6 = 0;
  if (pMap->nSize * 3 <= pMap->nEntry) {
    pChunk = pMap->apBucket;
    sVar3 = pMap->nSize * 2;
    sVar8 = 0x10;
    if (sVar3 != 0) {
      sVar8 = sVar3;
    }
    ppjVar4 = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator,sVar8 * 8);
    if (ppjVar4 == (jx9_hashmap_node **)0x0) {
      iVar6 = -(uint)(pMap->nSize == 0);
    }
    else {
      SyZero(ppjVar4,sVar8 * 8);
      pMap->apBucket = ppjVar4;
      pMap->nSize = sVar8;
      iVar6 = 0;
      if (pChunk != (jx9_hashmap_node **)0x0) {
        ppjVar4 = &pMap->pFirst;
        uVar1 = pMap->nEntry;
        for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
          pjVar2 = *ppjVar4;
          pjVar2->pNextCollide = (jx9_hashmap_node *)0x0;
          pjVar2->pPrevCollide = (jx9_hashmap_node *)0x0;
          uVar7 = pjVar2->nHash & sVar8 - 1;
          ppjVar4 = pMap->apBucket;
          if (ppjVar4[uVar7] != (jx9_hashmap_node *)0x0) {
            pjVar2->pNextCollide = ppjVar4[uVar7];
            ppjVar4[uVar7]->pPrevCollide = pjVar2;
          }
          ppjVar4[uVar7] = pjVar2;
          ppjVar4 = &pjVar2->pPrev;
        }
        SyMemBackendFree(&pMap->pVm->sAllocator,pChunk);
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static sxi32 HashmapGrowBucket(jx9_hashmap *pMap)
{
	if( pMap->nEntry >= pMap->nSize * HASHMAP_FILL_FACTOR ){
		jx9_hashmap_node **apOld = pMap->apBucket;
		jx9_hashmap_node *pEntry, **apNew;
		sxu32 nNew = pMap->nSize << 1;
		sxu32 nBucket;
		sxu32 n;
		if( nNew < 1 ){
			nNew = 16;
		}
		/* Allocate a new bucket */
		apNew = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator, nNew * sizeof(jx9_hashmap_node *));
		if( apNew == 0 ){
			if( pMap->nSize < 1 ){
				return SXERR_MEM; /* Fatal */
			}
			/* Not so fatal here, simply a performance hit */
			return SXRET_OK;
		}
		/* Zero the table */
		SyZero((void *)apNew, nNew * sizeof(jx9_hashmap_node *));
		/* Reflect the change */
		pMap->apBucket = apNew;
		pMap->nSize = nNew;
		if( apOld == 0 ){
			/* First allocated table [i.e: no entry], return immediately */
			return SXRET_OK;
		}
		/* Rehash old entries */
		pEntry = pMap->pFirst;
		n = 0;
		for( ;; ){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Clear the old collision link */
			pEntry->pNextCollide = pEntry->pPrevCollide = 0;
			/* Link to the new bucket */
			nBucket = pEntry->nHash & (nNew - 1);
			if( pMap->apBucket[nBucket] != 0 ){
				pEntry->pNextCollide = pMap->apBucket[nBucket];
				pMap->apBucket[nBucket]->pPrevCollide = pEntry;
			}
			pMap->apBucket[nBucket] = pEntry;
			/* Point to the next entry */
			pEntry = pEntry->pPrev; /* Reverse link */
			n++;
		}
		/* Free the old table */
		SyMemBackendFree(&pMap->pVm->sAllocator, (void *)apOld);
	}
	return SXRET_OK;
}